

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_2.h
# Opt level: O0

void __thiscall
dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::dequeue
          (queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,directory *item)

{
  directory *in_RDI;
  node *temp;
  node *in_stack_ffffffffffffffd8;
  
  exchange<dlib::directory>(in_RDI,(directory *)in_stack_ffffffffffffffd8);
  *(long *)&(in_RDI->state).field_0x38 = *(long *)&(in_RDI->state).field_0x38 + 1;
  *(long *)&(in_RDI->state).field_0x28 = *(long *)&(in_RDI->state).field_0x28 + -1;
  if (*(long *)&(in_RDI->state).field_0x38 == 0x14) {
    *(undefined8 *)&(in_RDI->state).field_0x38 = 0;
    *(undefined8 *)&(in_RDI->state).full_name = **(undefined8 **)&(in_RDI->state).full_name;
    memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
    ::deallocate((memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
                  *)in_RDI,in_stack_ffffffffffffffd8);
  }
  else if (*(long *)&(in_RDI->state).field_0x28 == 0) {
    memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
    ::deallocate((memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
                  *)in_RDI,in_stack_ffffffffffffffd8);
  }
  (**(code **)(*(long *)&in_RDI->state + 0x18))();
  return;
}

Assistant:

void queue_kernel_2<T,block_size,mem_manager>::
    dequeue (
        T& item
    )
    {
        // swap out into item
        exchange(item,out->item[out_pos]);
        
        ++out_pos;
        --queue_size;

        // if this was the last element in this node then remove this node
        if (out_pos == block_size)
        {
            out_pos = 0;
            node* temp = out;
            out = out->next;
            pool.deallocate(temp);
        }
        else if (queue_size == 0)
        {
            pool.deallocate(out);
        }

        // put the enumerator at the start
        reset();
    }